

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O2

uint __thiscall IZDeflate::bi_reverse(IZDeflate *this,uint code,int len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = len + 1;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    uVar2 = code & 1;
    code = code >> 1;
    iVar4 = iVar4 + -1;
    uVar1 = (uVar2 | uVar3) * 2;
  } while (1 < iVar4);
  return uVar2 | uVar3 & 0x7fffffff;
}

Assistant:

unsigned IZDeflate::bi_reverse(unsigned code, int len)
    // unsigned code; /* the value to invert */
    // int len;       /* its bit length */
{
    unsigned res = 0;
    do {
        res |= code & 1;
        code >>= 1, res <<= 1;
    } while (--len > 0);
    return res >> 1;
}